

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O3

Vec_Ptr_t * Abc_FrameExportPtr(void)

{
  Bac_Man_t *p;
  Abc_Frame_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  char *__s;
  
  pAVar1 = Abc_FrameGetGlobalFrame();
  if (pAVar1 == (Abc_Frame_t *)0x0) {
    __s = "ABC framework is not started.";
  }
  else {
    pAVar1 = Abc_FrameGetGlobalFrame();
    p = (Bac_Man_t *)pAVar1->pAbcBac;
    if (p == (Bac_Man_t *)0x0) {
      puts("There is no CBA design present.");
    }
    pVVar2 = Bac_PtrDeriveFromCba(p);
    if (pVVar2 != (Vec_Ptr_t *)0x0) {
      return pVVar2;
    }
    __s = "Converting to Ptr has failed.";
  }
  puts(__s);
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * Abc_FrameExportPtr()
{
    Vec_Ptr_t * vPtr;
    Bac_Man_t * p;
    if ( Abc_FrameGetGlobalFrame() == NULL )
    {
        printf( "ABC framework is not started.\n" );
        return NULL;
    }
    p = Bac_AbcGetMan( Abc_FrameGetGlobalFrame() );
    if ( p == NULL )
        printf( "There is no CBA design present.\n" );
    vPtr = Bac_PtrDeriveFromCba( p );
    if ( vPtr == NULL )
        printf( "Converting to Ptr has failed.\n" );
    return vPtr;
}